

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.cpp
# Opt level: O0

void __thiscall libDAI::NDP::ComputeHeuristicVariableOrdering(NDP *this)

{
  long *plVar1;
  FactorGraph *pFVar2;
  size_type sVar3;
  reference pvVar4;
  value_type vVar5;
  reference pvVar6;
  ostream *this_00;
  long *in_RDI;
  size_t i_1;
  size_t varI;
  size_t i;
  VariableHasLowerDegree vhld;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> v;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> *in_stack_ffffffffffffff28;
  ostream *in_stack_ffffffffffffff30;
  VariableHasLowerDegree in_stack_ffffffffffffff40;
  __normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  in_stack_ffffffffffffff48;
  __normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  in_stack_ffffffffffffff50;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> *in_stack_ffffffffffffff78;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> *in_stack_ffffffffffffff80;
  FactorGraph *local_68;
  ulong local_58;
  VariableHasLowerDegree local_28;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> local_20;
  
  plVar1 = (long *)(**(code **)(*in_RDI + 0x20))();
  (**(code **)(*plVar1 + 0x38))();
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::vector
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pFVar2 = (FactorGraph *)(**(code **)(*in_RDI + 0x20))();
  VariableHasLowerDegree::VariableHasLowerDegree(&local_28,pFVar2);
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::begin(in_stack_ffffffffffffff28);
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::end(in_stack_ffffffffffffff28);
  std::
  sort<__gnu_cxx::__normal_iterator<libDAI::Var*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,libDAI::NDP::VariableHasLowerDegree>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::size(&local_20);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_ffffffffffffff50._M_current,(size_type)in_stack_ffffffffffffff48._M_current);
  local_58 = 0;
  while( true ) {
    sVar3 = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::size(&local_20);
    if (sVar3 <= local_58) break;
    plVar1 = (long *)(**(code **)(*in_RDI + 0x20))();
    pvVar4 = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::at
                       ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)
                        in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
    vVar5 = (**(code **)(*plVar1 + 0x40))(plVar1,pvVar4);
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
    *pvVar6 = vVar5;
    local_58 = local_58 + 1;
  }
  if (3 < (ulong)in_RDI[0x23]) {
    std::operator<<((ostream *)&std::cout,"variable ordering computed:\n[");
    local_68 = (FactorGraph *)0x0;
    while( true ) {
      in_stack_ffffffffffffff40._m_grm = local_68;
      pFVar2 = (FactorGraph *)
               std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::size(&local_20);
      if (pFVar2 <= in_stack_ffffffffffffff40._m_grm) break;
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
      in_stack_ffffffffffffff30 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar6);
      std::operator<<(in_stack_ffffffffffffff30,", ");
      local_68 = (FactorGraph *)((long)&(local_68->super_GraphicalModel)._vptr_GraphicalModel + 1);
    }
    this_00 = std::operator<<((ostream *)&std::cout,"]");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::~vector
            ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)in_stack_ffffffffffffff40._m_grm);
  return;
}

Assistant:

void NDP::ComputeHeuristicVariableOrdering()
    {
        //NDPMemFn vhld = &NDP::VariableHasLowerDegree;
        std::vector< Var > v = grm().vars();
        //variable with lower degrees first:
        VariableHasLowerDegree vhld(grm());
        std::sort(v.begin(), v.end(), vhld);

        _m_varOrder.resize( v.size() );
        for(size_t i=0; i<v.size(); i++)
        {
            size_t varI = grm().findVar( v.at(i) );
            _m_varOrder.at(i) = varI;
        }

        if( Props.verbose > 3)
        {
            cout << "variable ordering computed:\n[";
            for(size_t i=0; i<v.size(); i++)
                cout <<  _m_varOrder.at(i) << ", ";
            cout << "]"<<endl;
        }

    }